

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_egads.c
# Opt level: O2

REF_STATUS ref_egads_gap(REF_GEOM ref_geom,REF_INT node,REF_DBL *gap)

{
  REF_ADJ pRVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  undefined8 uVar5;
  REF_ADJ_ITEM pRVar6;
  int iVar7;
  ulong uVar8;
  char *pcVar9;
  REF_BOOL has_edge;
  REF_BOOL has_node;
  REF_DBL face_xyz [3];
  
  *gap = 0.0;
  uVar2 = ref_geom_is_a(ref_geom,node,0,&has_node);
  if (uVar2 == 0) {
    uVar2 = ref_geom_is_a(ref_geom,node,1,&has_edge);
    if (uVar2 == 0) {
      if (has_edge == 0) {
        return 0;
      }
      uVar8 = 0xffffffff;
      iVar7 = -1;
      if (-1 < node) {
        pRVar1 = ref_geom->ref_adj;
        uVar8 = 0xffffffff;
        iVar7 = -1;
        if (node < pRVar1->nnode) {
          uVar2 = pRVar1->first[(uint)node];
          uVar8 = 0xffffffff;
          iVar7 = -1;
          if ((long)(int)uVar2 != -1) {
            iVar7 = pRVar1->item[(int)uVar2].ref;
            uVar8 = (ulong)uVar2;
          }
        }
      }
      while( true ) {
        if ((int)uVar8 == -1) {
          iVar7 = -1;
          iVar4 = -1;
          if (node < 0) goto LAB_0020b713;
          pRVar1 = ref_geom->ref_adj;
          iVar7 = -1;
          if (pRVar1->nnode <= node) goto LAB_0020b713;
          iVar3 = pRVar1->first[(uint)node];
          iVar7 = -1;
          if (iVar3 == -1) goto LAB_0020b713;
          pRVar6 = pRVar1->item;
          do {
            iVar7 = pRVar6[iVar3].ref;
            iVar4 = iVar3;
LAB_0020b713:
            do {
              if (iVar4 == -1) {
                return 0;
              }
              if (ref_geom->descr[iVar7 * 6] == 2) {
                uVar2 = ref_egads_eval(ref_geom,iVar7,face_xyz,(REF_DBL *)0x0);
                uVar5 = 0xf04;
                goto LAB_0020b700;
              }
              pRVar6 = ref_geom->ref_adj->item;
              iVar3 = pRVar6[iVar4].next;
              iVar7 = -1;
              iVar4 = iVar3;
            } while (iVar3 == -1);
          } while( true );
        }
        if ((uint)(has_node == 0) * 2 == ref_geom->descr[iVar7 * 6]) break;
        pRVar6 = ref_geom->ref_adj->item;
        uVar8 = (ulong)pRVar6[(int)uVar8].next;
        iVar7 = -1;
        if (uVar8 != 0xffffffffffffffff) {
          iVar7 = pRVar6[uVar8].ref;
        }
      }
      uVar2 = ref_egads_eval(ref_geom,iVar7,face_xyz,(REF_DBL *)0x0);
      uVar5 = 0xefe;
LAB_0020b700:
      pcVar9 = "eval";
      goto LAB_0020b60e;
    }
    uVar5 = 0xef4;
  }
  else {
    uVar5 = 0xef3;
  }
  pcVar9 = "n";
LAB_0020b60e:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_egads.c",uVar5,
         "ref_egads_gap",(ulong)uVar2,pcVar9);
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_egads_gap(REF_GEOM ref_geom, REF_INT node,
                                 REF_DBL *gap) {
  REF_INT item, geom, type;
  REF_DBL dist, face_xyz[3], gap_xyz[3];
  REF_BOOL has_node, has_edge;
  *gap = 0.0;

  RSS(ref_geom_is_a(ref_geom, node, REF_GEOM_NODE, &has_node), "n");
  RSS(ref_geom_is_a(ref_geom, node, REF_GEOM_EDGE, &has_edge), "n");
  if (!has_edge) return REF_SUCCESS;

  if (has_node) {
    type = REF_GEOM_NODE;
  } else {
    type = REF_GEOM_FACE;
  }
  each_ref_geom_having_node(ref_geom, node, item, geom) {
    if (type == ref_geom_type(ref_geom, geom)) {
      RSS(ref_egads_eval(ref_geom, geom, gap_xyz, NULL), "eval");
    }
  }

  each_ref_geom_having_node(ref_geom, node, item, geom) {
    if (REF_GEOM_FACE == ref_geom_type(ref_geom, geom)) {
      RSS(ref_egads_eval(ref_geom, geom, face_xyz, NULL), "eval");
      dist = sqrt(pow(face_xyz[0] - gap_xyz[0], 2) +
                  pow(face_xyz[1] - gap_xyz[1], 2) +
                  pow(face_xyz[2] - gap_xyz[2], 2));
      (*gap) = MAX((*gap), dist);
    }
  }

  return REF_SUCCESS;
}